

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O0

void __thiscall MutexLocker::~MutexLocker(MutexLocker *this)

{
  MutexLocker *in_RDI;
  
  ~MutexLocker(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

MutexLocker::~MutexLocker()
{
	if (mutex != NULL) mutex->unlock();
}